

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

boolean maybe_cannibal(int pm,boolean allowmsg)

{
  boolean bVar1;
  uint uVar2;
  
  bVar1 = '\0';
  if (((urole.malenum != 0x15b) && (urace.malenum != 0x4a)) && (urace.malenum != 0xe8)) {
    if ((mons[pm].mflags2 & (int)urace.selfmask) == 0) {
      return '\0';
    }
    if (allowmsg != '\0') {
      if (u.umonnum != u.umonster) {
        pline("You have a bad feeling deep inside.");
      }
      pline("You cannibal!  You will regret this!");
    }
    u.uprops[0x14].intrinsic._3_1_ = u.uprops[0x14].intrinsic._3_1_ | 4;
    uVar2 = mt_random();
    change_luck(-2 - ((byte)uVar2 & 3));
    bVar1 = '\x01';
  }
  return bVar1;
}

Assistant:

static boolean maybe_cannibal(int pm, boolean allowmsg)
{
	if (!CANNIBAL_ALLOWED() && your_race(&mons[pm])) {
		if (allowmsg) {
			if (Upolyd)
				pline("You have a bad feeling deep inside.");
			pline("You cannibal!  You will regret this!");
		}
		HAggravate_monster |= FROMOUTSIDE;
		change_luck(-rn1(4,2));		/* -5..-2 */
		return TRUE;
	}
	return FALSE;
}